

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bend.hpp
# Opt level: O0

string * __thiscall OpenMD::Bend::getName_abi_cxx11_(Bend *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x78));
  return in_RDI;
}

Assistant:

virtual std::string getName() { return name_; }